

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

Direction * __thiscall
entityx::EntityManager::get_component_ptr<Direction>(EntityManager *this,Id id)

{
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *this_00;
  char *__s;
  reference ppBVar1;
  Direction *pDVar2;
  int __c;
  BasePool *in_RDI;
  BasePool *pool;
  value_type n;
  Id local_8;
  
  this_00 = (vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)(in_RDI + 0x18);
  __s = (char *)component_family<Direction>();
  ppBVar1 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
            operator[](this_00,(size_type)__s);
  n = *ppBVar1;
  Entity::Id::index(&local_8,__s,__c);
  pDVar2 = (Direction *)BasePool::get(in_RDI,(size_t)n);
  return pDVar2;
}

Assistant:

C *get_component_ptr(Entity::Id id) {
    assert(valid(id));
    BasePool *pool = component_pools_[component_family<C>()];
    assert(pool);
    return static_cast<C*>(pool->get(id.index()));
  }